

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__skip(stbi__context *s,int n)

{
  int iVar1;
  stbi_uc *psVar2;
  int iVar3;
  
  if (n < 0) {
    psVar2 = s->img_buffer_end;
  }
  else {
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar2 = s->img_buffer;
    }
    else {
      psVar2 = s->img_buffer;
      iVar3 = (int)s->img_buffer_end - (int)psVar2;
      iVar1 = n - iVar3;
      if (iVar1 != 0 && iVar3 <= n) {
        s->img_buffer = s->img_buffer_end;
        (*(s->io).skip)(s->io_user_data,iVar1);
        return;
      }
    }
    psVar2 = psVar2 + (uint)n;
  }
  s->img_buffer = psVar2;
  return;
}

Assistant:

static void stbi__skip(stbi__context *s, int n)
{
    if (n < 0)
    {
        s->img_buffer = s->img_buffer_end;
        return;
    }
    if (s->io.read)
    {
        int blen = (int) (s->img_buffer_end - s->img_buffer);
        if (blen < n)
        {
            s->img_buffer = s->img_buffer_end;
            (s->io.skip)(s->io_user_data, n - blen);
            return;
        }
    }
    s->img_buffer += n;
}